

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void glcts::vectorNormalize<3u,4u>(GLfloat *data,GLuint index)

{
  GLuint i;
  long lVar1;
  uint uVar2;
  float fVar3;
  
  uVar2 = index << 2;
  fVar3 = 0.0;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    fVar3 = fVar3 + data[(ulong)uVar2 + lVar1] * data[(ulong)uVar2 + lVar1];
  }
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    data[(ulong)uVar2 + lVar1] = data[(ulong)uVar2 + lVar1] * (1.0 / fVar3);
  }
  return;
}

Assistant:

void vectorNormalize(glw::GLfloat* data, glw::GLuint index)
{
	glw::GLfloat* components = data + index * N_Components;

	glw::GLfloat sqr_length = 0.0f;

	for (glw::GLuint i = 0; i < N_NormalizedComponents; ++i)
	{
		const glw::GLfloat component = components[i];

		sqr_length += component * component;
	}

	const glw::GLfloat length = sqrtf(sqr_length);
	const glw::GLfloat factor = 1.0f / length;

	for (glw::GLuint i = 0; i < N_NormalizedComponents; ++i)
	{
		components[i] *= factor;
	}
}